

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item::move(Fl_Tree_Item *this,Fl_Tree_Item *item,int op,int pos)

{
  uint from;
  int iVar1;
  Fl_Tree_Item *pFVar2;
  Fl_Tree_Item *local_38;
  
  if (op == 2) {
    local_38 = this->_parent;
    from = find_child(local_38,this);
  }
  else {
    if ((op != 1) && (op != 0)) {
      return -3;
    }
    local_38 = this->_parent;
    pFVar2 = item->_parent;
    from = find_child(local_38,this);
    pos = find_child(pFVar2,item);
    item = pFVar2;
  }
  if (item == (Fl_Tree_Item *)0x0) {
    return -1;
  }
  if (-1 < (int)(pos | from)) {
    if (local_38 == item) {
      if (op == 1) {
        if (pos < (int)from) {
          pos = pos + (uint)(pos < (item->_children)._total);
        }
      }
      else if (op == 0) {
        pos = pos - (uint)(0 < pos && (int)from < pos);
      }
      iVar1 = Fl_Tree_Item_Array::move(&local_38->_children,pos,from);
      if (-1 < iVar1) {
        return 0;
      }
    }
    else if (pos <= (item->_children)._total) {
      pFVar2 = deparent(local_38,from);
      if (pFVar2 == (Fl_Tree_Item *)0x0) {
        return -5;
      }
      iVar1 = reparent(item,this,pos);
      if (-1 < iVar1) {
        return 0;
      }
      reparent(item,this,0);
      return -6;
    }
    return -4;
  }
  return -2;
}

Assistant:

int Fl_Tree_Item::move(Fl_Tree_Item *item, int op, int pos) {
  Fl_Tree_Item *from_parent, *to_parent;
  int from, to;
  switch (op) {
    case 0:	// "above"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 1:	// "below"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 2:	// "into"
      from_parent = this->parent();
      to_parent   = item;
      from        = from_parent->find_child(this);
      to          = pos;
      break;
    default:
      return -3;
  }
  if ( !from_parent || !to_parent ) return -1;
  if ( from < 0 || to < 0 ) return -2;
  if ( from_parent == to_parent ) {		// same parent?
    switch (op) {				// 'to' offsets due to scroll
      case 0: if ( from < to && to > 0 ) --to; break;
      case 1: if ( from > to && to < to_parent->children() ) ++to; break;
    }
    if ( from_parent->move(to, from) < 0 )	// simple move among siblings
      return -4;
  } else {					// different parent?
    if ( to > to_parent->children() )		// try to prevent a reparent() error
      return -4;
    if ( from_parent->deparent(from) == NULL )	// deparent self from current parent
      return -5;
    if ( to_parent->reparent(this, to) < 0 ) {	// reparent self to new parent at position 'to'
      to_parent->reparent(this, 0);		// failed? shouldn't happen, reparent at 0
      return -6;
    }
  }
  return 0;
}